

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int sat_solver2_solve(sat_solver2 *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,
                     ABC_INT64_T nInsLimit,ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  uint uVar1;
  ABC_INT64_T *pAVar2;
  ABC_INT64_T *pAVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  bool bVar9;
  clause cVar10;
  uint *activity;
  int *piVar11;
  clause *pcVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  varinfo2 *pvVar16;
  uint *puVar17;
  int iVar18;
  ulong uVar19;
  char cVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  timespec ts;
  sat_solver2 *local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_58;
  double local_50;
  timespec local_48;
  long local_38;
  
  s->hLearntLast = -1;
  s->hProofLast = -1;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit == 0) {
    lVar15 = 0;
  }
  else {
    lVar15 = nConfLimit + (s->stats).conflicts;
    s->nConfLimit = lVar15;
  }
  if (nInsLimit == 0) {
    lVar25 = 0;
  }
  else {
    lVar25 = nInsLimit + (s->stats).propagations;
    s->nInsLimit = lVar25;
  }
  pAVar2 = &s->nConfLimit;
  if ((nConfLimitGlobal != 0) && (lVar15 == 0 || nConfLimitGlobal < lVar15)) {
    *pAVar2 = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && (lVar25 == 0 || nInsLimitGlobal < lVar25)) {
    s->nInsLimit = nInsLimitGlobal;
  }
  iVar21 = (int)((ulong)((long)end - (long)begin) >> 2);
  s->root_level = iVar21;
  local_98 = s;
  if (begin < end) {
    do {
      uVar22 = *begin;
      iVar21 = (int)uVar22 >> 1;
      if (s->size <= iVar21) {
        __assert_fail("lit_var(p) < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x76a,
                      "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                     );
      }
      iVar14 = s->qtail;
      uVar13 = (s->trail_lim).size;
      piVar11 = (s->trail_lim).ptr;
      if (uVar13 == (s->trail_lim).cap) {
        iVar23 = (uVar13 >> 1) * 3;
        if ((int)uVar13 < 4) {
          iVar23 = uVar13 * 2;
        }
        if (piVar11 == (int *)0x0) {
          piVar11 = (int *)malloc((long)iVar23 << 2);
        }
        else {
          piVar11 = (int *)realloc(piVar11,(long)iVar23 << 2);
        }
        (s->trail_lim).ptr = piVar11;
        if (piVar11 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->trail_lim).cap * 9.5367431640625e-07,0),
                 (double)iVar23 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->trail_lim).cap = iVar23;
        uVar13 = (s->trail_lim).size;
      }
      (s->trail_lim).size = uVar13 + 1;
      piVar11[(int)uVar13] = iVar14;
      uVar13 = (uint)s->assigns[iVar21];
      if (uVar13 == 3) {
        s->assigns[iVar21] = (byte)uVar22 & 1;
        s->levels[iVar21] = (s->trail_lim).size;
        s->reasons[iVar21] = 0;
        iVar21 = s->qtail;
        s->qtail = iVar21 + 1;
        s->trail[iVar21] = uVar22;
      }
      else if ((uVar22 & 1) != uVar13) {
        uVar13 = s->reasons[iVar21];
        if (uVar13 == 0) {
          if ((s->conf_final).size < 0) {
LAB_004fb998:
            __assert_fail("k <= v->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                          ,0x30,"void veci_resize(veci *, int)");
          }
          (s->conf_final).size = 0;
          iVar14 = 0;
          if ((s->conf_final).cap == 0) {
            piVar11 = (s->conf_final).ptr;
            if (piVar11 == (int *)0x0) {
              piVar11 = (int *)malloc(0);
            }
            else {
              piVar11 = (int *)realloc(piVar11,0);
            }
            (s->conf_final).ptr = piVar11;
            if (piVar11 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),0);
              fflush(_stdout);
            }
            (s->conf_final).cap = 0;
            iVar14 = (s->conf_final).size;
          }
          piVar11 = (s->conf_final).ptr;
          (s->conf_final).size = iVar14 + 1;
          piVar11[iVar14] = uVar22 ^ 1;
          if (0 < s->levels[iVar21]) {
            uVar13 = (s->conf_final).size;
            iVar21 = -1;
            if (uVar13 == (s->conf_final).cap) {
              iVar14 = (uVar13 >> 1) * 3;
              if ((int)uVar13 < 4) {
                iVar14 = uVar13 * 2;
              }
              piVar11 = (int *)realloc(piVar11,(long)iVar14 << 2);
              (s->conf_final).ptr = piVar11;
              if (piVar11 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),
                       (double)iVar14 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->conf_final).cap = iVar14;
              uVar13 = (s->conf_final).size;
            }
            goto LAB_004fb71b;
          }
          iVar21 = -1;
        }
        else {
          uVar1 = (s->Mem).uPageMask & uVar13;
          if (uVar1 == 0) {
LAB_004fb8f4:
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                          ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          iVar21 = solver2_analyze_final
                             (s,(clause *)
                                ((s->Mem).pPages[(int)uVar13 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                                (int)uVar1),1);
          uVar13 = (s->conf_final).size;
          if (uVar13 == (s->conf_final).cap) {
            iVar14 = (uVar13 >> 1) * 3;
            if ((int)uVar13 < 4) {
              iVar14 = uVar13 * 2;
            }
            piVar11 = (s->conf_final).ptr;
            if (piVar11 == (int *)0x0) {
              piVar11 = (int *)malloc((long)iVar14 << 2);
            }
            else {
              piVar11 = (int *)realloc(piVar11,(long)iVar14 << 2);
            }
            (s->conf_final).ptr = piVar11;
            if (piVar11 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),
                     (double)iVar14 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->conf_final).cap = iVar14;
            uVar13 = (s->conf_final).size;
          }
          uVar22 = uVar22 ^ 1;
          piVar11 = (s->conf_final).ptr;
LAB_004fb71b:
          (s->conf_final).size = uVar13 + 1;
          piVar11[(int)uVar13] = uVar22;
        }
        s->hProofLast = iVar21;
        goto LAB_004fb72f;
      }
      local_98 = s;
      pcVar12 = solver2_propagate(s);
      if (pcVar12 != (clause *)0x0) {
        iVar21 = solver2_analyze_final(s,pcVar12,0);
        if ((s->conf_final).size < 1) {
LAB_004fba57:
          __assert_fail("s->conf_final.size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x78b,
                        "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                       );
        }
        s->hProofLast = iVar21;
LAB_004fb72f:
        solver2_canceluntil(s,0);
        return -1;
      }
      begin = (lit *)((uint *)begin + 1);
    } while (begin < end);
    iVar21 = s->root_level;
  }
  if (iVar21 != (s->trail_lim).size) {
    __assert_fail("s->root_level == solver2_dlevel(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x792,
                  "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                 );
  }
  if (0 < s->verbosity) {
    Abc_Print((int)local_98,
              "==================================[MINISAT]===================================\n");
    Abc_Print((int)local_98,
              "| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
    Abc_Print((int)local_98,
              "|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
    Abc_Print((int)local_98,
              "==============================================================================\n");
  }
  local_58 = 0;
  do {
    if (0 < s->verbosity) {
      uVar22 = (s->stats).learnts;
      dVar28 = (double)uVar22;
      dVar29 = (double)(s->stats).learnts_literals;
      dVar30 = 0.0;
      if (uVar22 != 0) {
        dVar30 = dVar29 / dVar28;
      }
      Abc_Print((int)local_98,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
                (double)(s->stats).clauses_literals,(double)s->nLearntMax,dVar28,dVar29,dVar30,
                s->progress_estimate * 100.0);
      fflush(_stdout);
    }
    if (s->nRuntimeLimit != 0) {
      iVar14 = 3;
      iVar21 = clock_gettime(3,&local_48);
      if (iVar21 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      if (s->nRuntimeLimit < lVar15) {
        cVar20 = '\0';
LAB_004fb5b6:
        if (0 < s->verbosity) {
          Abc_Print(iVar14,
                    "==============================================================================\n"
                   );
        }
        solver2_canceluntil(s,0);
        return (int)cVar20;
      }
    }
    if (((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) &&
       (s->pPrf2 == (Prf_Man_t *)0x0)) {
      sat_solver2_reducedb(s);
    }
    iVar21 = (int)local_58;
    if (iVar21 == 0) {
      iVar14 = 0;
      iVar23 = 0;
    }
    else {
      iVar18 = 1;
      iVar23 = 0;
      do {
        iVar23 = iVar23 + 1;
        iVar14 = iVar18 * 2;
        iVar18 = iVar18 * 2 + 1;
      } while (iVar14 < iVar21);
    }
    if (iVar14 != iVar21) {
      do {
        iVar23 = iVar23 + -1;
        local_58 = (long)(int)local_58 % (long)(iVar14 >> 1);
        iVar14 = (iVar14 >> 1) + -1;
      } while (iVar14 != (int)local_58);
    }
    dVar28 = ldexp(1.0,iVar23);
    if (s->root_level != (s->trail_lim).size) {
LAB_004fb95a:
      __assert_fail("s->root_level == solver2_dlevel(s)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x3f2,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
    }
    (s->stats).starts = (s->stats).starts + 1;
    local_50 = 0.019999999552965164;
    if (s->fNotUseRandom != 0) {
      local_50 = 0.0;
    }
    local_58 = (ulong)(iVar21 + 1);
    local_98 = (sat_solver2 *)malloc(0x10);
    local_8c = 4;
    local_80 = 0;
    lVar15 = 0;
    local_38 = (long)(dVar28 * 100.0);
LAB_004fa957:
    bVar27 = -1 < local_38;
    bVar9 = local_38 <= lVar15;
    while (pcVar12 = solver2_propagate(s), pcVar12 == (clause *)0x0) {
      if (bVar9 && bVar27) {
LAB_004fb540:
        dVar28 = solver2_progress(s);
        s->progress_estimate = dVar28;
        solver2_canceluntil(s,s->root_level);
        cVar20 = '\0';
        goto LAB_004fb4f4;
      }
      if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
        iVar21 = clock_gettime(3,&local_48);
        if (iVar21 < 0) {
          lVar25 = -1;
        }
        else {
          lVar25 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        if (s->nRuntimeLimit < lVar25) goto LAB_004fb540;
      }
      if (((*pAVar2 != 0) && (*pAVar2 < (s->stats).conflicts)) ||
         ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_004fb540;
      pAVar3 = &(s->stats).decisions;
      *pAVar3 = *pAVar3 + 1;
      puVar17 = (uint *)(s->order).ptr;
      dVar28 = s->random_seed * 1389796.0;
      piVar11 = s->orderpos;
      dVar28 = dVar28 - (double)(int)(dVar28 / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar28;
      if (local_50 <= dVar28 / 2147483647.0) {
LAB_004faade:
        do {
          uVar13 = (s->order).size;
          if ((int)uVar13 < 1) goto LAB_004fb4ab;
          uVar22 = *puVar17;
          uVar1 = uVar13 - 1;
          uVar24 = puVar17[uVar1];
          (s->order).size = uVar1;
          uVar19 = (ulong)(int)uVar22;
          piVar11[uVar19] = -1;
          if (uVar13 != 1) {
            iVar21 = 0;
            if (2 < uVar13) {
              puVar6 = s->activity;
              uVar13 = puVar6[(int)uVar24];
              iVar14 = 1;
              iVar21 = 0;
              do {
                iVar23 = iVar14 + 1;
                if (((int)uVar1 <= iVar23) ||
                   (puVar6[(int)puVar17[iVar23]] <= puVar6[(int)puVar17[iVar14]])) {
                  iVar23 = iVar14;
                }
                uVar4 = puVar17[iVar23];
                if (puVar6[(int)uVar4] <= uVar13) break;
                puVar17[iVar21] = uVar4;
                piVar11[(int)uVar4] = iVar21;
                iVar14 = iVar23 * 2 + 1;
                iVar21 = iVar23;
              } while (iVar14 < (int)uVar1);
            }
            puVar17[iVar21] = uVar24;
            piVar11[(int)uVar24] = iVar21;
          }
        } while (s->assigns[uVar19] != '\x03');
        if (uVar22 != 0xffffffff) goto LAB_004faba4;
LAB_004fb4ab:
        if (0 < s->size) {
          pcVar8 = s->assigns;
          lVar15 = 0;
          do {
            if (pcVar8[lVar15] == '\x03') {
              __assert_fail("var_value(s,i) != varX",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x440,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
            }
            s->model[lVar15] = -(uint)(pcVar8[lVar15] != '\0') | 1;
            lVar15 = lVar15 + 1;
          } while (lVar15 < s->size);
        }
        solver2_canceluntil(s,s->root_level);
        cVar20 = '\x01';
        goto LAB_004fb4f4;
      }
      dVar28 = dVar28 * 1389796.0 -
               (double)(int)((dVar28 * 1389796.0) / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar28;
      uVar22 = (uint)((double)s->size * (dVar28 / 2147483647.0));
      if (((int)uVar22 < 0) || (s->size <= (int)uVar22)) {
        __assert_fail("next >= 0 && next < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x10f,"int order_select(sat_solver2 *, float)");
      }
      uVar19 = (ulong)uVar22;
      if (s->assigns[uVar19] != '\x03') goto LAB_004faade;
LAB_004faba4:
      uVar22 = uVar22 * 2;
      if (((uint)s->vi[uVar19] & 1) == 0) {
        uVar22 = uVar22 | 1;
      }
      solver2_assume(s,uVar22);
    }
    pAVar3 = &(s->stats).conflicts;
    *pAVar3 = *pAVar3 + 1;
    if (s->root_level < (s->trail_lim).size) {
      if ((int)local_80 < 0) goto LAB_004fb998;
      if ((s->tagged).size != 0) {
        __assert_fail("veci_size(&s->tagged) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x313,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
      }
      iVar21 = s->qtail;
      proof_chain_start(s,pcVar12);
      if (local_8c == 0) {
        if (local_98 == (sat_solver2 *)0x0) {
          local_98 = (sat_solver2 *)malloc(0);
        }
        else {
          local_98 = (sat_solver2 *)realloc(local_98,0);
        }
        if (local_98 == (sat_solver2 *)0x0) {
          sat_solver2_solve_cold_2();
          goto LAB_004fba57;
        }
      }
      lVar15 = lVar15 + 1;
      iVar21 = iVar21 + -1;
      local_98->size = -2;
      iVar14 = 0;
      local_88 = 1;
      uVar22 = 0;
      do {
        if (((uint)*pcVar12 & 1) != 0) {
          cVar10 = pcVar12[(ulong)((uint)*pcVar12 >> 0xb) + 1];
          if (((long)(int)cVar10 < 0) || ((s->act_clas).size <= (int)cVar10)) {
            __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
          }
          piVar7 = (s->act_clas).ptr;
          piVar11 = piVar7 + (int)cVar10;
          *piVar11 = *piVar11 + s->cla_inc;
          if (*piVar11 < 0) {
            if (0 < (s->act_clas).size) {
              lVar25 = 0;
              do {
                puVar17 = (uint *)(piVar7 + lVar25);
                *puVar17 = *puVar17 >> 0xe;
                lVar25 = lVar25 + 1;
              } while (lVar25 < (s->act_clas).size);
            }
            iVar23 = s->cla_inc >> 0xe;
            if (iVar23 < 0x401) {
              iVar23 = 0x400;
            }
            s->cla_inc = iVar23;
          }
        }
        if ((uint)(0 < (int)uVar22) < (uint)*pcVar12 >> 0xb) {
          uVar19 = (ulong)(0 < (int)uVar22);
          do {
            if ((uint)pcVar12[uVar19 + 1] < 2) break;
            uVar22 = (int)pcVar12[uVar19 + 1] >> 1;
            if (((int)uVar22 < 0) || (s->size <= (int)uVar22)) {
              __assert_fail("x >= 0 && x < s->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,799,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
            }
            pvVar16 = s->vi;
            if (((uint)pvVar16[uVar22] & 0x3c) == 0) {
              if (s->levels[uVar22] == 0) {
                proof_chain_resolve(s,(clause *)0x0,uVar22);
              }
              else {
                uVar13 = (s->tagged).size;
                piVar11 = (s->tagged).ptr;
                if (uVar13 == (s->tagged).cap) {
                  iVar23 = (uVar13 >> 1) * 3;
                  if ((int)uVar13 < 4) {
                    iVar23 = uVar13 * 2;
                  }
                  if (piVar11 == (int *)0x0) {
                    piVar11 = (int *)malloc((long)iVar23 << 2);
                  }
                  else {
                    piVar11 = (int *)realloc(piVar11,(long)iVar23 << 2);
                  }
                  (s->tagged).ptr = piVar11;
                  if (piVar11 == (int *)0x0) {
                    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                           SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                           (double)iVar23 * 9.5367431640625e-07);
                    fflush(_stdout);
                  }
                  (s->tagged).cap = iVar23;
                  uVar13 = (s->tagged).size;
                  pvVar16 = s->vi;
                }
                (s->tagged).size = uVar13 + 1;
                piVar11[(int)uVar13] = uVar22;
                *(byte *)(pvVar16 + uVar22) = *(byte *)(pvVar16 + uVar22) & 0xc3 | 4;
                puVar6 = s->activity;
                puVar17 = puVar6 + uVar22;
                *puVar17 = *puVar17 + s->var_inc;
                if ((int)*puVar17 < 0) {
                  if (0 < s->size) {
                    lVar25 = 0;
                    do {
                      puVar6[lVar25] = puVar6[lVar25] >> 0x13;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < s->size);
                  }
                  iVar23 = s->var_inc >> 0x13;
                  if (iVar23 < 0x11) {
                    iVar23 = 0x10;
                  }
                  s->var_inc = iVar23;
                }
                piVar11 = s->orderpos;
                uVar26 = (ulong)piVar11[uVar22];
                if (uVar26 != 0xffffffffffffffff) {
                  piVar7 = (s->order).ptr;
                  iVar23 = piVar7[uVar26];
                  if (piVar11[uVar22] == 0) {
                    uVar13 = 0;
                  }
                  else {
                    do {
                      uVar1 = (uint)uVar26;
                      uVar24 = (int)((uVar1 - ((int)(uVar1 - 1) >> 0x1f)) + -1) >> 1;
                      iVar18 = piVar7[(int)uVar24];
                      uVar13 = uVar1;
                      if (puVar6[iVar23] <= puVar6[iVar18]) break;
                      piVar7[(int)uVar1] = iVar18;
                      piVar11[iVar18] = uVar1;
                      uVar26 = (ulong)uVar24;
                      uVar13 = uVar24;
                    } while (2 < uVar1);
                  }
                  piVar7[(int)uVar13] = iVar23;
                  piVar11[iVar23] = uVar13;
                }
                if (s->levels[uVar22] == (s->trail_lim).size) {
                  iVar14 = iVar14 + 1;
                }
                else {
                  cVar10 = pcVar12[uVar19 + 1];
                  iVar23 = (int)local_88;
                  if (iVar23 == local_8c) {
                    local_8c = (int)(local_88 >> 1) * 3;
                    if (iVar23 < 4) {
                      local_8c = iVar23 * 2;
                    }
                    if (local_98 == (sat_solver2 *)0x0) {
                      local_98 = (sat_solver2 *)malloc((long)local_8c << 2);
                    }
                    else {
                      local_98 = (sat_solver2 *)realloc(local_98,(long)local_8c << 2);
                    }
                    if (local_98 == (sat_solver2 *)0x0) {
                      sat_solver2_solve_cold_1();
                      goto LAB_004fb95a;
                    }
                  }
                  local_88 = (ulong)(iVar23 + 1);
                  *(clause *)((local_98->Mem).nEntries + (long)iVar23 + -0x1e) = cVar10;
                }
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (uint)*pcVar12 >> 0xb);
        }
        puVar17 = (uint *)(s->trail + iVar21);
        do {
          uVar22 = *puVar17;
          iVar23 = (int)uVar22 >> 1;
          puVar17 = puVar17 + -1;
          iVar21 = iVar21 + -1;
        } while (((uint)s->vi[iVar23] & 0x3c) == 0);
        uVar13 = s->reasons[iVar23];
        if (uVar13 == 0) {
          pcVar12 = (clause *)0x0;
        }
        else {
          uVar1 = (s->Mem).uPageMask & uVar13;
          if (uVar1 == 0) goto LAB_004fb8f4;
          pcVar12 = (clause *)
                    ((s->Mem).pPages[(int)uVar13 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar1)
          ;
        }
        iVar14 = iVar14 + -1;
        if (iVar14 == 0) goto LAB_004fafd8;
        proof_chain_resolve(s,pcVar12,iVar23);
        if (pcVar12 == (clause *)0x0) {
          __assert_fail("c != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x31b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
        }
      } while( true );
    }
    iVar21 = solver2_analyze_final(s,pcVar12,0);
    if (iVar21 < 1 && s->pPrf1 != (Vec_Set_t *)0x0) {
      __assert_fail("proof_id > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x406,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
    }
    s->hProofLast = iVar21;
    cVar20 = -1;
LAB_004fb4f4:
    if (local_98 != (sat_solver2 *)0x0) {
      free(local_98);
    }
    iVar14 = (int)local_98;
    if ((((*pAVar2 != 0) && (*pAVar2 < (s->stats).conflicts)) ||
        ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) || (cVar20 != '\0'))
    goto LAB_004fb5b6;
  } while( true );
LAB_004fafd8:
  local_98->size = uVar22 ^ 1;
  if ((s->mark_levels).size != 0) {
    __assert_fail("veci_size(&s->mark_levels) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x33b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
  }
  if ((int)local_88 < 2) {
    if ((s->min_lit_order).size < 0) goto LAB_004fb998;
    (s->min_lit_order).size = 0;
    local_80 = 1;
  }
  else {
    uVar19 = 1;
    do {
      iVar21 = s->levels[(local_98->Mem).nEntries[uVar19 - 0x1e] >> 1];
      if ((s->trail_lim).size <= iVar21) {
        __assert_fail("level < veci_size(&s->trail_lim)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x83,"void var_lev_set_mark(sat_solver2 *, int)");
      }
      puVar17 = (uint *)((s->trail_lim).ptr + iVar21);
      *puVar17 = *puVar17 | 0x80000000;
      uVar22 = (s->mark_levels).size;
      piVar11 = (s->mark_levels).ptr;
      if (uVar22 == (s->mark_levels).cap) {
        iVar14 = (uVar22 >> 1) * 3;
        if ((int)uVar22 < 4) {
          iVar14 = uVar22 * 2;
        }
        if (piVar11 == (int *)0x0) {
          piVar11 = (int *)malloc((long)iVar14 << 2);
        }
        else {
          piVar11 = (int *)realloc(piVar11,(long)iVar14 << 2);
        }
        (s->mark_levels).ptr = piVar11;
        if (piVar11 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->mark_levels).cap * 9.5367431640625e-07,0),
                 (double)iVar14 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->mark_levels).cap = iVar14;
        uVar22 = (s->mark_levels).size;
      }
      (s->mark_levels).size = uVar22 + 1;
      piVar11[(int)uVar22] = iVar21;
      uVar19 = uVar19 + 1;
    } while (local_88 != uVar19);
    if ((s->min_lit_order).size < 0) goto LAB_004fb998;
    (s->min_lit_order).size = 0;
    local_80 = 1;
    uVar19 = 1;
    do {
      iVar21 = solver2_lit_removable_rec(s,(local_98->Mem).nEntries[uVar19 - 0x1e] >> 1);
      if (iVar21 == 0) {
        iVar21 = (int)local_80;
        local_80 = (ulong)(iVar21 + 1);
        (local_98->Mem).nEntries[(long)iVar21 + -0x1e] = (local_98->Mem).nEntries[uVar19 - 0x1e];
      }
      uVar19 = uVar19 + 1;
    } while (local_88 != uVar19);
  }
  if (s->fProofLogging == 0) {
    iVar21 = 0;
  }
  else {
    if ((s->min_step_order).size < 0) goto LAB_004fb998;
    (s->min_step_order).size = 0;
    if (0 < (s->min_lit_order).size) {
      piVar11 = (s->min_lit_order).ptr;
      lVar25 = 0;
      do {
        solver2_logging_order_rec(s,piVar11[lVar25]);
        lVar25 = lVar25 + 1;
      } while (lVar25 < (s->min_lit_order).size);
      lVar25 = (long)(s->min_step_order).size;
      if (0 < lVar25) {
        piVar11 = (s->min_step_order).ptr;
        do {
          iVar21 = piVar11[lVar25 + -1];
          uVar22 = s->reasons[iVar21];
          if (uVar22 == 0) {
            pcVar12 = (clause *)0x0;
          }
          else {
            uVar13 = (s->Mem).uPageMask & uVar22;
            if (uVar13 == 0) goto LAB_004fb8f4;
            pcVar12 = (clause *)
                      ((s->Mem).pPages[(int)uVar22 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                      (int)uVar13);
          }
          proof_chain_resolve(s,pcVar12,iVar21);
          cVar10 = *pcVar12;
          if (0xfff < (uint)cVar10) {
            uVar19 = 1;
            do {
              if ((uint)pcVar12[uVar19 + 1] < 2) break;
              iVar21 = (int)pcVar12[uVar19 + 1] >> 1;
              if (s->levels[iVar21] == 0) {
                proof_chain_resolve(s,(clause *)0x0,iVar21);
                cVar10 = *pcVar12;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 < (uint)cVar10 >> 0xb);
          }
          bVar9 = 1 < lVar25;
          lVar25 = lVar25 + -1;
        } while (bVar9);
      }
    }
    iVar21 = proof_chain_stop(s);
  }
  iVar14 = (s->mark_levels).size;
  if (0 < iVar14) {
    piVar11 = (s->mark_levels).ptr;
    piVar7 = (s->trail_lim).ptr;
    lVar25 = 0;
    do {
      puVar17 = (uint *)(piVar7 + piVar11[lVar25]);
      *puVar17 = *puVar17 & 0x7fffffff;
      lVar25 = lVar25 + 1;
      iVar14 = (s->mark_levels).size;
    } while (lVar25 < iVar14);
  }
  if (iVar14 < 0) goto LAB_004fb998;
  (s->mark_levels).size = 0;
  iVar14 = (int)local_80;
  if ((int)local_88 < iVar14) goto LAB_004fb998;
  pAVar3 = &(s->stats).tot_literals;
  *pAVar3 = *pAVar3 + (long)iVar14;
  iVar23 = (s->tagged).size;
  if (0 < iVar23) {
    piVar11 = (s->tagged).ptr;
    lVar25 = 0;
    do {
      *(byte *)(s->vi + piVar11[lVar25]) = *(byte *)(s->vi + piVar11[lVar25]) & 0xc3;
      lVar25 = lVar25 + 1;
      iVar23 = (s->tagged).size;
    } while (lVar25 < iVar23);
  }
  if (iVar23 < 0) goto LAB_004fb998;
  (s->tagged).size = 0;
  piVar11 = &s->root_level;
  if (1 < iVar14) {
    iVar23 = local_98->cap;
    piVar11 = s->levels;
    if (iVar14 != 2) {
      iVar18 = piVar11[iVar23 >> 1];
      uVar19 = 1;
      uVar26 = 2;
      do {
        iVar5 = piVar11[(local_98->Mem).nEntries[uVar26 - 0x1e] >> 1];
        if (iVar18 < iVar5) {
          uVar19 = uVar26 & 0xffffffff;
        }
        if (iVar18 <= iVar5) {
          iVar18 = iVar5;
        }
        uVar26 = uVar26 + 1;
      } while (local_80 != uVar26);
      local_98->cap = (local_98->Mem).nEntries[(long)(int)uVar19 + -0x1e];
      (local_98->Mem).nEntries[(long)(int)uVar19 + -0x1e] = iVar23;
      iVar23 = local_98->cap;
    }
    piVar11 = piVar11 + (iVar23 >> 1);
  }
  iVar23 = *piVar11;
  if (*piVar11 < s->root_level) {
    iVar23 = s->root_level;
  }
  solver2_canceluntil(s,iVar23);
  iVar21 = clause2_create_new(s,&local_98->size,(local_98->Mem).nEntries + (long)iVar14 + -0x1e,1,
                              iVar21);
  if (iVar14 < 1) {
    __assert_fail("veci_size(cls) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x221,"void solver2_record(sat_solver2 *, veci *, int)");
  }
  iVar23 = iVar21;
  if (iVar14 == 1) {
    iVar23 = 0;
    if (s->fProofLogging != 0) {
      uVar22 = local_98->size >> 1;
      if ((-1 < (int)uVar22) && ((int)uVar22 < s->size)) {
        if (s->units[uVar22] == 0) {
          s->units[uVar22] = iVar21;
          s->nUnits = s->nUnits + 1;
          iVar23 = 0;
          goto LAB_004fb413;
        }
      }
      __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
    }
  }
LAB_004fb413:
  iVar21 = local_98->size;
  iVar18 = iVar21 >> 1;
  if (s->assigns[iVar18] == '\x03') {
    s->assigns[iVar18] = (byte)iVar21 & 1;
    s->levels[iVar18] = (s->trail_lim).size;
    s->reasons[iVar18] = iVar23;
    iVar23 = s->qtail;
    s->qtail = iVar23 + 1;
    s->trail[iVar23] = iVar21;
  }
  if (iVar14 == 1) {
    s->levels[local_98->size >> 1] = 0;
  }
  s->var_inc = (s->var_inc >> 4) + s->var_inc;
  s->cla_inc = (s->cla_inc >> 10) + s->cla_inc;
  goto LAB_004fa957;
}

Assistant:

int sat_solver2_solve(sat_solver2* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    int restart_iter = 0;
    ABC_INT64_T  nof_conflicts;
    lbool status = l_Undef;
    int proof_id;
    lit * i;

    s->hLearntLast = -1;
    s->hProofLast = -1;

    // set the external limits
//    s->nCalls++;
//    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;

/*
    // Perform assumptions:
    root_level = assumps.size();
    for (int i = 0; i < assumps.size(); i++){
        Lit p = assumps[i];
        assert(var(p) < nVars());
        if (!solver2_assume(p)){
            GClause r = reason[var(p)];
            if (r != Gclause2_NULL){
                clause* confl;
                if (r.isLit()){
                    confl = propagate_tmpbin;
                    (*confl)[1] = ~p;
                    (*confl)[0] = r.lit();
                }else
                    confl = r.clause();
                analyzeFinal(confl, true);
                conflict.push(~p);
            }else
                conflict.clear(),
                conflict.push(~p);
            cancelUntil(0);
            return false; }
        clause* confl = propagate();
        if (confl != NULL){
            analyzeFinal(confl), assert(conflict.size() > 0);
            cancelUntil(0);
            return false; }
    }
    assert(root_level == decisionLevel());
*/

    // Perform assumptions:
    s->root_level = end - begin;
    for ( i = begin; i < end; i++ )
    {
        lit p = *i;
        assert(lit_var(p) < s->size);
        veci_push(&s->trail_lim,s->qtail);
        if (!solver2_enqueue(s,p,0))
        {
            clause* r = clause2_read(s, lit_reason(s,p));
            if (r != NULL)
            {
                clause* confl = r;
                proof_id = solver2_analyze_final(s, confl, 1);
                veci_push(&s->conf_final, lit_neg(p));
            }
            else
            {
//                assert( 0 );
//                r = var_unit_clause( s, lit_var(p) );
//                assert( r != NULL );
//                proof_id = clause2_proofid(s, r, 0);
                proof_id = -1; // the only case when ProofId is not assigned (conflicting assumptions)
                veci_resize(&s->conf_final,0);
                veci_push(&s->conf_final, lit_neg(p));
                // the two lines below are a bug fix by Siert Wieringa 
                if (var_level(s, lit_var(p)) > 0)
                    veci_push(&s->conf_final, p);
            }
            s->hProofLast = proof_id;
            solver2_canceluntil(s, 0);
            return l_False;
        }
        else
        {
            clause* confl = solver2_propagate(s);
            if (confl != NULL){
                proof_id = solver2_analyze_final(s, confl, 0);
                assert(s->conf_final.size > 0);
                s->hProofLast = proof_id;
                solver2_canceluntil(s, 0);
                return l_False;
            }
        }
    }
    assert(s->root_level == solver2_dlevel(s));

    if (s->verbosity >= 1){
        Abc_Print(1,"==================================[MINISAT]===================================\n");
        Abc_Print(1,"| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        Abc_Print(1,"|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        Abc_Print(1,"==============================================================================\n");
    }

    while (status == l_Undef){
        if (s->verbosity >= 1)
        {
            Abc_Print(1,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)s->stats.conflicts,
                (double)s->stats.clauses,
                (double)s->stats.clauses_literals,
                (double)s->nLearntMax,
                (double)s->stats.learnts,
                (double)s->stats.learnts_literals,
                (s->stats.learnts == 0)? 0.0 : (double)s->stats.learnts_literals / s->stats.learnts,
                s->progress_estimate*100);
            fflush(stdout);
        }
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        // reduce the set of learnt clauses
        if ( s->nLearntMax && veci_size(&s->act_clas) >= s->nLearntMax && s->pPrf2 == NULL )
            sat_solver2_reducedb(s);
        // perform next run
        nof_conflicts = (ABC_INT64_T)( 100 * luby2(2, restart_iter++) );
        status = solver2_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
    }
    if (s->verbosity >= 1)
        Abc_Print(1,"==============================================================================\n");

    solver2_canceluntil(s,0);
//    assert( s->qhead == s->qtail );
//    if ( status == l_True )
//        sat_solver2_verify( s );
    return status;
}